

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

uint P_GetPortal(int type,int plane,sector_t *from,sector_t *to,DVector2 *displacement)

{
  FSectorPortal *pFVar1;
  double dVar2;
  FSectorPortal *pFVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  uVar4 = TArray<FSectorPortal,_FSectorPortal>::Reserve(&sectorPortals,1);
  pFVar3 = sectorPortals.Array;
  pFVar1 = sectorPortals.Array + uVar4;
  pFVar1->mType = 0;
  pFVar1->mFlags = 0;
  pFVar1->mPartner = 0;
  pFVar1->mPlane = 0;
  pFVar3[uVar4].mOrigin = (sector_t *)0x0;
  (&pFVar3[uVar4].mOrigin)[1] = (sector_t *)0x0;
  pFVar3[uVar4].mDisplacement.X = 0.0;
  pFVar3[uVar4].mDisplacement.Y = 0.0;
  pFVar3[uVar4].mPlaneZ = 0.0;
  *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar3[uVar4].mPlaneZ + 1) =
       (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  pFVar3[uVar4].mType = type;
  pFVar3[uVar4].mPlane = plane;
  pFVar3[uVar4].mOrigin = from;
  pFVar3[uVar4].mDestination = to;
  dVar2 = displacement->Y;
  pFVar3[uVar4].mDisplacement.X = displacement->X;
  pFVar3[uVar4].mDisplacement.Y = dVar2;
  if (type == 3) {
    dVar2 = from->planes[plane].TexZ;
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    uVar5 = 0xe0000000;
    uVar6 = 0x47efffff;
  }
  pFVar3[uVar4].mPlaneZ = (double)CONCAT44(uVar6,uVar5);
  return uVar4;
}

Assistant:

unsigned P_GetPortal(int type, int plane, sector_t *from, sector_t *to, const DVector2 &displacement)
{
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = type;
	sectorPortals[i].mPlane = plane;
	sectorPortals[i].mOrigin = from;
	sectorPortals[i].mDestination = to;
	sectorPortals[i].mDisplacement = displacement;
	sectorPortals[i].mPlaneZ = type == PORTS_LINKEDPORTAL? from->GetPlaneTexZ(plane) : FLT_MAX;
	return i;
}